

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O3

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  long lVar2;
  uint uVar3;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  
  if ((heapBucket->super_HeapBucket).heapInfo == this->heapInfo) {
    uVar3 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    pSVar4 = (this->finalizableWithBarrierData).bucketData[uVar3].pendingSweepList;
    if (pSVar4 == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar5 = 1;
      do {
        lVar7 = lVar5;
        pSVar1 = (pSVar4->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
                 super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
                 super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
        if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
        pSVar4 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock);
        lVar5 = lVar7 + 1;
      } while (pSVar4 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                         0x0);
    }
    pSVar4 = (this->finalizableWithBarrierData).bucketData[uVar3].pendingEmptyBlockList;
    if (pSVar4 == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar2 = 1;
      do {
        lVar5 = lVar2;
        pSVar1 = (pSVar4->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
                 super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
                 super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
        if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
        pSVar4 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock);
        lVar2 = lVar5 + 1;
      } while (pSVar4 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                         0x0);
    }
    sVar6 = lVar5 + lVar7;
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}